

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartReg.c
# Opt level: O3

void Aig_ManRegManStop(Aig_ManPre_t *p)

{
  Vec_Ptr_t *pVVar1;
  void *pvVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  Vec_Flt_t *__ptr;
  float *__ptr_00;
  int iVar5;
  long lVar6;
  
  pVVar1 = p->vMatrix;
  iVar5 = pVVar1->nSize;
  if (0 < iVar5) {
    lVar6 = 0;
    do {
      pvVar2 = pVVar1->pArray[lVar6];
      if (pvVar2 != (void *)0x0) {
        if (*(void **)((long)pvVar2 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar2 + 8));
        }
        free(pvVar2);
        iVar5 = pVVar1->nSize;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar5);
  }
  if (pVVar1->pArray != (void **)0x0) {
    free(pVVar1->pArray);
  }
  free(pVVar1);
  pVVar1 = p->vParts;
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    iVar5 = pVVar1->nSize;
    if (0 < iVar5) {
      lVar6 = 0;
      do {
        pvVar2 = pVVar1->pArray[lVar6];
        if (pvVar2 != (void *)0x0) {
          if (*(void **)((long)pvVar2 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar2 + 8));
          }
          free(pvVar2);
          iVar5 = pVVar1->nSize;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < iVar5);
    }
    if (pVVar1->pArray != (void **)0x0) {
      free(pVVar1->pArray);
    }
    free(pVVar1);
  }
  pVVar3 = p->vRegs;
  piVar4 = pVVar3->pArray;
  if (piVar4 != (int *)0x0) {
    free(piVar4);
  }
  free(pVVar3);
  pVVar3 = p->vUniques;
  piVar4 = pVVar3->pArray;
  if (piVar4 != (int *)0x0) {
    free(piVar4);
  }
  free(pVVar3);
  pVVar3 = p->vFreeVars;
  piVar4 = pVVar3->pArray;
  if (piVar4 != (int *)0x0) {
    free(piVar4);
  }
  free(pVVar3);
  __ptr = p->vPartCost;
  __ptr_00 = __ptr->pArray;
  if (__ptr_00 != (float *)0x0) {
    free(__ptr_00);
  }
  free(__ptr);
  if (p->pfUsedRegs != (char *)0x0) {
    free(p->pfUsedRegs);
    p->pfUsedRegs = (char *)0x0;
  }
  if (p->pfPartVars != (char *)0x0) {
    free(p->pfPartVars);
  }
  free(p);
  return;
}

Assistant:

void Aig_ManRegManStop( Aig_ManPre_t * p )
{
    Vec_VecFree( (Vec_Vec_t *)p->vMatrix );
    if ( p->vParts )
        Vec_VecFree( (Vec_Vec_t *)p->vParts );
    Vec_IntFree( p->vRegs );
    Vec_IntFree( p->vUniques );
    Vec_IntFree( p->vFreeVars );
    Vec_FltFree( p->vPartCost );
    ABC_FREE( p->pfUsedRegs );
    ABC_FREE( p->pfPartVars );
    ABC_FREE( p );
}